

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O2

uvec4 ImageCodec::decodeUINT_UINTVec<unsigned_int,3>(ImageCodec *param_1,void *ptr)

{
  uint uVar1;
  anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3 aVar2;
  uint *puVar3;
  int i;
  long lVar4;
  anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3 local_38;
  
  local_38._0_8_ = 0;
  local_38._8_8_ = 0;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    uVar1 = *(uint *)((long)ptr + lVar4 * 4);
    puVar3 = glm::vec<4,_unsigned_int,_(glm::precision)0>::operator[]
                       ((vec<4,_unsigned_int,_(glm::precision)0> *)&local_38.field_0,
                        (length_type)lVar4);
    *puVar3 = uVar1;
  }
  aVar2._8_8_ = local_38._8_8_;
  aVar2._0_8_ = local_38._0_8_;
  return (anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3)aVar2.field_0;
}

Assistant:

static glm::uvec4 decodeUINT_UINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::uvec4 result(0, 0, 0, 0);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i];
        return result;
    }